

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int GA_Pgroup_create(int *list,int count)

{
  Integer *list_00;
  Integer IVar1;
  ulong uVar2;
  
  list_00 = (Integer *)malloc((long)count * 8);
  if (0 < count) {
    uVar2 = 0;
    do {
      list_00[uVar2] = (long)list[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  IVar1 = pnga_pgroup_create(list_00,(long)count);
  free(list_00);
  return (int)IVar1;
}

Assistant:

int GA_Pgroup_create(int *list, int count)
{
    Integer acount = (Integer)count;
    int i;
    int grp_id;
    Integer *_ga_map_capi;
    _ga_map_capi = (Integer*)malloc(count * sizeof(Integer));
    for (i=0; i<count; i++)
       _ga_map_capi[i] = (Integer)list[i];
    grp_id = (int)wnga_pgroup_create(_ga_map_capi,acount);
    free(_ga_map_capi);
    return grp_id;
}